

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_server.h
# Opt level: O0

void __thiscall
rest_rpc::rpc_service::rpc_server::publish<std::__cxx11::string>
          (rpc_server *this,string *key,string *token,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  string_view msg;
  bool bVar1;
  rpc_server *this_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
  ec;
  element_type *this_01;
  string *in_RCX;
  error_category *s;
  size_type in_RSI;
  char *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>_>
  pVar2;
  error_code eVar3;
  shared_ptr<rest_rpc::rpc_service::connection> conn;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>
  it;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>_>
  range;
  unique_lock<std::mutex> lock;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  shared_data;
  unique_lock<std::mutex> lock_1;
  key_type *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  rpc_server *in_stack_fffffffffffffe68;
  string *this_02;
  string local_150 [16];
  string *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  connection *in_stack_fffffffffffffed0;
  string local_f0 [48];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
  local_c0;
  string local_b8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
  local_98;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
  local_90 [5];
  string local_68 [52];
  uint local_34;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (mutex_type *)in_stack_fffffffffffffe58);
  bVar1 = std::
          unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>_>
          ::empty((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>_>
                   *)0x20c8e8);
  local_34 = (uint)bVar1;
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  if (local_34 == 0) {
    this_02 = local_68;
    std::__cxx11::string::string(this_02,in_RCX);
    get_shared_data<std::__cxx11::string>
              (in_stack_fffffffffffffe68,
               (string *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    std::__cxx11::string::~string(local_68);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (mutex_type *)in_stack_fffffffffffffe58);
    this_00 = (rpc_server *)(in_RDI + 0x230);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    pVar2 = std::
            unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>_>
            ::equal_range((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          in_stack_fffffffffffffe58);
    local_90[0]._M_cur =
         (__node_type *)
         pVar2.second.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
         ._M_cur;
    ec._M_cur = (__node_type *)
                pVar2.first.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                ._M_cur;
    local_98._M_cur = ec._M_cur;
    std::__cxx11::string::~string(local_b8);
    bVar1 = std::__detail::operator!=(&local_98,local_90);
    if (bVar1) {
      local_c0._M_cur = local_98._M_cur;
      while (bVar1 = std::__detail::operator!=(&local_c0,local_90), bVar1) {
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>
        ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>
                      *)0x20ca4c);
        std::weak_ptr<rest_rpc::rpc_service::connection>::lock
                  ((weak_ptr<rest_rpc::rpc_service::connection> *)in_stack_fffffffffffffe68);
        bVar1 = std::operator==((shared_ptr<rest_rpc::rpc_service::connection> *)
                                CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                                in_stack_fffffffffffffe58);
        if (bVar1) {
LAB_0020ca93:
          local_34 = 4;
        }
        else {
          this_01 = std::
                    __shared_ptr_access<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x20ca82);
          bVar1 = connection::has_closed(this_01);
          if (bVar1) goto LAB_0020ca93;
          in_stack_fffffffffffffe68 =
               (rpc_server *)
               std::
               __shared_ptr_access<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x20cb2e);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)this_00);
          std::
          __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          connection::publish(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                              in_stack_fffffffffffffec0);
          std::__cxx11::string::~string(local_f0);
          local_34 = 0;
        }
        std::shared_ptr<rest_rpc::rpc_service::connection>::~shared_ptr
                  ((shared_ptr<rest_rpc::rpc_service::connection> *)0x20cb95);
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>
                      *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      }
    }
    else {
      eVar3 = asio::error::make_error_code(0);
      s = eVar3._M_cat;
      in_stack_fffffffffffffe64 = eVar3._M_value;
      std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RCX);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe68,
                     (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
      basic_string_view<std::allocator<char>>
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s);
      msg.size_ = in_RSI;
      msg.data_ = (const_pointer)this_02;
      error_callback(this_00,(error_code *)ec._M_cur,msg);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
      std::__cxx11::string::~string(local_150);
    }
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x20cd07);
  }
  return;
}

Assistant:

void publish(std::string key, std::string token, T data) {
    {
      std::unique_lock<std::mutex> lock(sub_mtx_);
      if (sub_map_.empty())
        return;
    }

    std::shared_ptr<std::string> shared_data =
        get_shared_data<T>(std::move(data));
    std::unique_lock<std::mutex> lock(sub_mtx_);
    auto range = sub_map_.equal_range(key + token);
    if (range.first != range.second) {
      for (auto it = range.first; it != range.second; ++it) {
        auto conn = it->second.lock();
        if (conn == nullptr || conn->has_closed()) {
          continue;
        }

        conn->publish(key + token, *shared_data);
      }
    } else {
      error_callback(
          asio::error::make_error_code(asio::error::invalid_argument),
          "The subscriber of the key: " + key + " does not exist.");
    }
  }